

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_hash_reject(bt_peer_connection *this,int received)

{
  bool bVar1;
  int iVar2;
  file_index_t f;
  int32_t b;
  int32_t i;
  uint uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  element_type *peVar5;
  torrent_info *this_00;
  file_storage *this_01;
  difference_type dVar6;
  span<const_char> sVar7;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  local_120;
  const_iterator local_118;
  const_iterator local_110;
  uint local_104;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  local_100;
  hash_request *local_f8;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  local_f0;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  local_e8;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  new_end;
  undefined1 local_d8 [8];
  hash_request hr;
  int proof_layers;
  int count;
  int index;
  int base;
  file_index_t file_index;
  sha256_hash file_root;
  char *ptr;
  undefined1 local_78 [8];
  span<const_char> recv_buffer;
  undefined1 local_58 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  error_code local_40;
  undefined1 local_29;
  error_code local_28;
  int local_14;
  bt_peer_connection *pbStack_10;
  int received_local;
  bt_peer_connection *this_local;
  
  local_14 = received;
  pbStack_10 = this;
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])();
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0x1f) & 1) == 0) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_28,invalid_message,(type *)0x0);
    local_29 = 2;
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&local_28,1,2);
  }
  else {
    iVar2 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
    if (iVar2 == 0x31) {
      bVar1 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
      if (bVar1) {
        peer_connection::associated_torrent((peer_connection *)&recv_buffer.m_len);
        ::std::weak_ptr<libtorrent::aux::torrent>::lock
                  ((weak_ptr<libtorrent::aux::torrent> *)local_58);
        ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
                  ((weak_ptr<libtorrent::aux::torrent> *)&recv_buffer.m_len);
        sVar7 = crypto_receive_buffer::get(&this->m_recv_buffer);
        recv_buffer.m_ptr = (char *)sVar7.m_len;
        local_78 = (undefined1  [8])sVar7.m_ptr;
        pcVar4 = span<const_char>::begin((span<const_char> *)local_78);
        file_root.m_number._M_elems._24_8_ = pcVar4 + 1;
        digest32<256L>::digest32((digest32<256L> *)&base,(char *)file_root.m_number._M_elems._24_8_)
        ;
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58);
        this_00 = torrent::torrent_file(peVar5);
        this_01 = torrent_info::files(this_00);
        f = file_storage::file_index_for_root(this_01,(sha256_hash *)&base);
        dVar6 = digest32<256L>::size();
        file_root.m_number._M_elems._24_8_ = file_root.m_number._M_elems._24_8_ + dVar6;
        b = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
        i = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
        hr.proof_layers = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
        hr.count = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
        new_end._M_current._4_4_ = f;
        hash_request::hash_request((hash_request *)local_d8,f,b,i,hr.proof_layers,hr.count);
        bVar1 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
        if (bVar1) {
          uVar3 = strong_typedef::operator_cast_to_int((strong_typedef *)local_d8);
          peer_connection::peer_log
                    (&this->super_peer_connection,incoming_message,"HASH_REJECT",
                     "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)uVar3,
                     (ulong)(uint)local_d8._4_4_,hr.file.m_val,hr.base,hr.index);
        }
        local_f0._M_current =
             (hash_request *)
             ::std::
             vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>::
             begin(&this->m_hash_requests);
        local_f8 = (hash_request *)
                   ::std::
                   vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                   ::end(&this->m_hash_requests);
        local_e8 = ::std::
                   remove<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_request*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>,libtorrent::aux::hash_request>
                             (local_f0,(__normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
                                        )local_f8,(hash_request *)local_d8);
        local_100._M_current =
             (hash_request *)
             ::std::
             vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>::
             end(&this->m_hash_requests);
        bVar1 = __gnu_cxx::operator==(&local_e8,&local_100);
        if (!bVar1) {
          __gnu_cxx::
          __normal_iterator<libtorrent::aux::hash_request_const*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>
          ::__normal_iterator<libtorrent::aux::hash_request*>
                    ((__normal_iterator<libtorrent::aux::hash_request_const*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>
                      *)&local_110,&local_e8);
          local_120._M_current =
               (hash_request *)
               ::std::
               vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
               ::end(&this->m_hash_requests);
          __gnu_cxx::
          __normal_iterator<libtorrent::aux::hash_request_const*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>
          ::__normal_iterator<libtorrent::aux::hash_request*>
                    ((__normal_iterator<libtorrent::aux::hash_request_const*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>
                      *)&local_118,&local_120);
          ::std::
          vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>::
          erase(&this->m_hash_requests,local_110,local_118);
          peVar5 = ::std::
                   __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_58);
          torrent::hashes_rejected(peVar5,(hash_request *)local_d8);
          maybe_send_hash_request(this);
        }
        local_104 = (uint)bVar1;
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)local_58);
      }
    }
    else {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_40,invalid_hash_reject,(type *)0x0);
      t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = 2;
      (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                (this,&local_40,1,2);
    }
  }
  return;
}

Assistant:

void bt_peer_connection::on_hash_reject(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_recv_buffer.packet_size() != 1 + 32 + 4 + 4 + 4 + 4)
		{
			disconnect(errors::invalid_hash_reject, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		span<char const> recv_buffer = m_recv_buffer.get();
		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t const file_index = t->torrent_file().files().file_index_for_root(file_root);
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);
		hash_request hr(file_index, base, index, count, proof_layers);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASH_REJECT"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		auto new_end = std::remove(m_hash_requests.begin(), m_hash_requests.end(), hr);
		if (new_end == m_hash_requests.end()) return;
		m_hash_requests.erase(new_end, m_hash_requests.end());

		t->hashes_rejected(hr);

		maybe_send_hash_request();
	}